

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Option *pOVar6;
  Option *pOVar7;
  long lVar8;
  Layer *pLVar9;
  ulong uVar10;
  pointer pMVar11;
  void *in_R8;
  size_t i;
  ulong uVar12;
  bool bVar13;
  Mat bottom_blob;
  Mat bottom_blob_bf16;
  allocator_type local_c9;
  Mat local_c8;
  Mat local_88;
  Net *local_40;
  Option *local_38;
  
  pLVar9 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
           super__Vector_impl_data._M_start[layer_index];
  local_40 = this;
  if (pLVar9->one_blob_only == true) {
    pOVar7 = *(Option **)
              &(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data;
    iVar2 = *(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = *(int *)pOVar7;
    pMVar11 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pMVar11[iVar2].dims == 0) {
      pOVar7 = opt;
      iVar4 = forward_layer(this,(this->blobs).
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                                 .super__Vector_impl_data._M_start[iVar2].producer,blob_mats,opt);
      if (iVar4 != 0) {
        return iVar4;
      }
      pMVar11 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    iVar4 = (int)pOVar7;
    Mat::Mat(&local_c8,pMVar11 + iVar2);
    if (((opt->lightmode == true) &&
        (Mat::release((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar2), pLVar9->support_inplace == true))
       && (*(int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_) != 1)) {
      Mat::clone(&local_88,(__fn *)&local_c8,(void *)0x0,iVar4,in_R8);
      Mat::operator=(&local_c8,&local_88);
      Mat::~Mat(&local_88);
    }
    if (opt->use_bf16_storage == true) {
      uVar12 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      uVar10 = (ulong)local_c8.elempack;
      if ((uVar12 / uVar10 == 4) && (pLVar9->support_bf16_storage == true)) {
        local_88.elemsize._0_4_ = 0;
        local_88._20_8_ = 0;
        local_88.data = (void *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.c = 0;
        local_88.cstep = 0;
        cast_float32_to_bfloat16(&local_c8,&local_88,opt);
        Mat::operator=(&local_c8,&local_88);
        Mat::~Mat(&local_88);
        uVar12 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
        uVar10 = (ulong)local_c8.elempack;
      }
      if ((uVar12 / uVar10 == 2) && (pLVar9->support_bf16_storage == false)) {
        local_88.elemsize._0_4_ = 0;
        local_88._20_8_ = 0;
        local_88.data = (void *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.c = 0;
        local_88.cstep = 0;
        cast_bfloat16_to_float32(&local_c8,&local_88,opt);
        Mat::operator=(&local_c8,&local_88);
        Mat::~Mat(&local_88);
      }
    }
    if (opt->use_packing_layout == true) {
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.c = 0;
      local_88.cstep = 0;
      convert_packing(&local_c8,&local_88,
                      (uint)pLVar9->support_packing + (uint)pLVar9->support_packing * 2 + 1,opt);
      Mat::operator=(&local_c8,&local_88);
      Mat::~Mat(&local_88);
    }
    if ((opt->lightmode == true) && (pLVar9->support_inplace == true)) {
      iVar2 = (*pLVar9->_vptr_Layer[9])(pLVar9,&local_c8,opt);
      if (iVar2 == 0) {
        iVar2 = 0;
        bVar13 = true;
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + iVar5,&local_c8);
      }
      else {
        bVar13 = false;
      }
    }
    else {
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.c = 0;
      local_88.cstep = 0;
      iVar2 = (*pLVar9->_vptr_Layer[7])(pLVar9,&local_c8,&local_88,opt);
      bVar13 = iVar2 == 0;
      if (bVar13) {
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + iVar5,&local_88);
      }
      Mat::~Mat(&local_88);
    }
    Mat::~Mat(&local_c8);
    goto LAB_0011bea5;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88,
             (long)(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             *(long *)&(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data >> 2,(allocator_type *)&local_c8);
  lVar8 = 0;
  pOVar7 = (Option *)0x0;
  while( true ) {
    lVar1 = *(long *)&(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    pOVar6 = (Option *)
             ((long)(pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - lVar1 >> 2);
    if (pOVar6 <= pOVar7) break;
    iVar2 = *(int *)(lVar1 + (long)pOVar7 * 4);
    pMVar11 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    local_38 = pOVar7;
    if (pMVar11[iVar2].dims == 0) {
      pOVar6 = opt;
      uVar3 = forward_layer(local_40,(local_40->blobs).
                                     super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                     _M_impl.super__Vector_impl_data._M_start[iVar2].producer,
                            blob_mats,opt);
      if (uVar3 != 0) goto LAB_0011bdc0;
      pMVar11 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    iVar5 = (int)pOVar6;
    Mat::operator=((Mat *)((long)local_88.data + lVar8),pMVar11 + iVar2);
    if (((opt->lightmode == true) &&
        (Mat::release((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar2), pLVar9->support_inplace == true))
       && (**(int **)((long)local_88.data + lVar8 + 8) != 1)) {
      Mat::clone(&local_c8,(__fn *)((long)local_88.data + lVar8),(void *)0x0,iVar5,in_R8);
      Mat::operator=((Mat *)((long)local_88.data + lVar8),&local_c8);
      Mat::~Mat(&local_c8);
    }
    if (opt->use_bf16_storage == true) {
      uVar12 = *(ulong *)((long)local_88.data + lVar8 + 0x10);
      uVar10 = (ulong)*(int *)((long)local_88.data + lVar8 + 0x18);
      if ((uVar12 / uVar10 == 4) && (pLVar9->support_bf16_storage == true)) {
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.h = 0;
        local_c8.c = 0;
        local_c8.cstep = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        cast_float32_to_bfloat16((Mat *)((long)local_88.data + lVar8),&local_c8,opt);
        Mat::operator=((Mat *)((long)local_88.data + lVar8),&local_c8);
        Mat::~Mat(&local_c8);
        uVar12 = *(ulong *)((long)local_88.data + lVar8 + 0x10);
        uVar10 = (ulong)*(int *)((long)local_88.data + lVar8 + 0x18);
      }
      if ((uVar12 / uVar10 == 2) && (pLVar9->support_bf16_storage == false)) {
        local_c8.elemsize._0_4_ = 0;
        local_c8.elemsize._4_4_ = 0;
        local_c8.elempack = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.h = 0;
        local_c8.c = 0;
        local_c8.cstep = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        cast_bfloat16_to_float32((Mat *)((long)local_88.data + lVar8),&local_c8,opt);
        Mat::operator=((Mat *)((long)local_88.data + lVar8),&local_c8);
        Mat::~Mat(&local_c8);
      }
    }
    if (opt->use_packing_layout == true) {
      local_c8.elemsize._0_4_ = 0;
      local_c8.elemsize._4_4_ = 0;
      local_c8.elempack = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.h = 0;
      local_c8.c = 0;
      local_c8.cstep = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      convert_packing((Mat *)((long)local_88.data + lVar8),&local_c8,
                      (uint)pLVar9->support_packing + (uint)pLVar9->support_packing * 2 + 1,opt);
      Mat::operator=((Mat *)((long)local_88.data + lVar8),&local_c8);
      Mat::~Mat(&local_c8);
    }
    pOVar7 = (Option *)&local_38->field_0x1;
    lVar8 = lVar8 + 0x40;
  }
  if ((opt->lightmode == true) && (pLVar9->support_inplace == true)) {
    uVar3 = (*pLVar9->_vptr_Layer[8])(pLVar9,&local_88,opt);
    if (uVar3 == 0) {
      lVar8 = 0;
      for (uVar12 = 0;
          lVar1 = *(long *)&(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data,
          uVar12 < (ulong)((long)(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - lVar1 >> 2);
          uVar12 = uVar12 + 1) {
        Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + *(int *)(lVar1 + uVar12 * 4),
                       (Mat *)((long)local_88.data + lVar8));
        lVar8 = lVar8 + 0x40;
      }
      bVar13 = true;
    }
    else {
LAB_0011bdc0:
      pLVar9 = (Layer *)(ulong)uVar3;
      bVar13 = false;
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8,
               (long)(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,&local_c9);
    uVar3 = (*pLVar9->_vptr_Layer[6])(pLVar9,&local_88,&local_c8,opt);
    if (uVar3 != 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
      goto LAB_0011bdc0;
    }
    lVar8 = 0;
    for (uVar12 = 0;
        lVar1 = *(long *)&(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data,
        uVar12 < (ulong)((long)(pLVar9->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar1 >> 2); uVar12 = uVar12 + 1)
    {
      Mat::operator=((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start + *(int *)(lVar1 + uVar12 * 4),
                     (Mat *)((long)local_c8.data + lVar8));
      lVar8 = lVar8 + 0x40;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
    pLVar9 = (Layer *)0x0;
    bVar13 = true;
  }
  iVar2 = (int)pLVar9;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_88);
LAB_0011bea5:
  if (bVar13) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_bf16_storage)
        {
            if (bottom_blob.elemsize / bottom_blob.elempack == 4u && layer->support_bf16_storage)
            {
                Mat bottom_blob_bf16;
                cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
                bottom_blob = bottom_blob_bf16;
            }
            if (bottom_blob.elemsize / bottom_blob.elempack == 2u && !layer->support_bf16_storage)
            {
                Mat bottom_blob_fp32;
                cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
                bottom_blob = bottom_blob_fp32;
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_bf16_storage)
            {
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 4u && layer->support_bf16_storage)
                {
                    Mat bottom_blob_bf16;
                    cast_float32_to_bfloat16(bottom_blobs[i], bottom_blob_bf16, opt);
                    bottom_blobs[i] = bottom_blob_bf16;
                }
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 2u && !layer->support_bf16_storage)
                {
                    Mat bottom_blob_fp32;
                    cast_bfloat16_to_float32(bottom_blobs[i], bottom_blob_fp32, opt);
                    bottom_blobs[i] = bottom_blob_fp32;
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}